

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::getBasicPrimalInfeasibility(HEkkPrimal *this)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar9 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x20,0);
  pHVar3 = this->ekk_instance_;
  dVar1 = (pHVar3->options_->super_HighsOptionsStruct).primal_feasibility_tolerance;
  (pHVar3->info_).num_primal_infeasibilities = 0;
  (pHVar3->info_).max_primal_infeasibility = 0.0;
  (pHVar3->info_).sum_primal_infeasibilities = 0.0;
  iVar7 = this->num_row;
  if (0 < iVar7) {
    pdVar4 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 0.0;
    dVar11 = 0.0;
    lVar8 = 0;
    do {
      dVar2 = pdVar4[lVar8];
      dVar12 = pdVar5[lVar8];
      if (dVar12 - dVar1 <= dVar2) {
        dVar12 = pdVar6[lVar8];
        if (dVar1 + dVar12 < dVar2) {
          dVar12 = dVar2 - dVar12;
          goto LAB_00359978;
        }
      }
      else {
        dVar12 = dVar12 - dVar2;
LAB_00359978:
        if (0.0 < dVar12) {
          if (dVar1 < dVar12) {
            iVar9 = iVar9 + 1;
            (pHVar3->info_).num_primal_infeasibilities = iVar9;
            iVar7 = this->num_row;
          }
          if (dVar11 <= dVar12) {
            dVar11 = dVar12;
          }
          (pHVar3->info_).max_primal_infeasibility = dVar11;
          dVar10 = dVar10 + dVar12;
          (pHVar3->info_).sum_primal_infeasibilities = dVar10;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x20,0);
  return;
}

Assistant:

void HEkkPrimal::getBasicPrimalInfeasibility() {
  // Gets the num/max/sum of basic primal infeasibilities,
  analysis->simplexTimerStart(ComputePrIfsClock);
  const double primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt& num_primal_infeasibility = info.num_primal_infeasibilities;
  double& max_primal_infeasibility = info.max_primal_infeasibility;
  double& sum_primal_infeasibility = info.sum_primal_infeasibilities;
  const HighsInt updated_num_primal_infeasibility = num_primal_infeasibility;
  num_primal_infeasibility = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibility = 0;

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double value = info.baseValue_[iRow];
    double lower = info.baseLower_[iRow];
    double upper = info.baseUpper_[iRow];
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (value < lower - primal_feasibility_tolerance) {
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      primal_infeasibility = value - upper;
    }
    if (primal_infeasibility > 0) {
      if (primal_infeasibility > primal_feasibility_tolerance)
        num_primal_infeasibility++;
      max_primal_infeasibility =
          std::max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibility += primal_infeasibility;
    }
  }
  if (updated_num_primal_infeasibility >= 0) {
    // The number of primal infeasibilities should be correct
    bool num_primal_infeasibility_ok =
        num_primal_infeasibility == updated_num_primal_infeasibility;
    // if (!num_primal_infeasibility_ok)
    //   printf("In iteration %" HIGHSINT_FORMAT
    //          ": num_primal_infeasibility = %" HIGHSINT_FORMAT
    //          " != %" HIGHSINT_FORMAT
    //          " = "
    //          "updated_num_primal_infeasibility\n",
    //          ekk_instance_.iteration_count_, num_primal_infeasibility,
    //          updated_num_primal_infeasibility);

    assert(num_primal_infeasibility_ok);
  }
  analysis->simplexTimerStop(ComputePrIfsClock);
}